

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

CopyConst<char,_ElementType<2UL>_>_conflict * __thiscall
absl::lts_20250127::container_internal::internal_layout::
LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long,1ul>,std::integer_sequence<unsigned_long,0ul,1ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
::Pointer<2ul,char>(LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long,1ul>,std::integer_sequence<unsigned_long,0ul,1ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                    *this,char *p)

{
  if (((ulong)p & 7) == 0) {
    return (CopyConst<char,_ElementType<2UL>_>_conflict *)(p + *(long *)this * 8 + 0x10);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long, 0, 1>, std::integer_sequence<unsigned long, 0, 1, 2>, std::integer_sequence<unsigned long, 0, 1, 2>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long, 0, 1>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2>, N = 2UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
    using C = typename std::remove_const<Char>::type;
    static_assert(
        std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
        "The argument must be a pointer to [const] [signed|unsigned] char");
    constexpr size_t alignment = Alignment();
    (void)alignment;
    assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
    return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
  }